

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrow
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Throw *curr)

{
  Literal *other;
  size_t sVar1;
  long lVar2;
  Iterator IVar3;
  undefined1 local_e0 [8];
  value_type item;
  Literals arguments;
  size_t local_88;
  char *pcStack_80;
  SmallVector<wasm::Literal,_1UL> local_78;
  size_t local_40;
  Type *local_38;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  item.type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  generateArguments(__return_storage_ptr__,this,&curr->operands,(Literals *)&item.type);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&item.type);
    return __return_storage_ptr__;
  }
  local_78.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.fixed._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  local_78.fixed._M_elems[0].type.id = 0;
  local_78.usedFixed = 0;
  local_78.fixed._M_elems[0].field_0.i64 = 0;
  local_88 = (curr->tag).super_IString.str._M_len;
  pcStack_80 = (curr->tag).super_IString.str._M_str;
  local_38 = &item.type;
  IVar3 = SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)local_38);
  local_40 = IVar3.
             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
             .index;
  lVar2 = -0x18;
  local_38 = (Type *)((ulong)local_38 ^
                     (ulong)IVar3.
                            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                            .parent);
  for (sVar1 = 0; local_40 != sVar1 || local_38 != (Type *)0x0; sVar1 = sVar1 + 1) {
    other = (Literal *)
            (arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar2);
    if (sVar1 == 0) {
      other = (Literal *)&arguments;
    }
    Literal::Literal((Literal *)local_e0,other);
    SmallVector<wasm::Literal,_1UL>::push_back(&local_78,(Literal *)local_e0);
    Literal::~Literal((Literal *)local_e0);
    lVar2 = lVar2 + 0x18;
  }
  (*this->_vptr_ExpressionRunner[4])(this,&local_88);
  handle_unreachable("throw",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x56c);
}

Assistant:

Flow visitThrow(Throw* curr) {
    NOTE_ENTER("Throw");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(curr->tag);
    WasmException exn;
    exn.tag = curr->tag;
    for (auto item : arguments) {
      exn.values.push_back(item);
    }
    throwException(exn);
    WASM_UNREACHABLE("throw");
  }